

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
                       ZSTD_tableFillPurpose_e tfp)

{
  U32 *pUVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  BYTE *pBVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  U32 p;
  ulong uVar12;
  long lVar13;
  int local_38;
  
  pUVar1 = ms->hashTable;
  uVar3 = (ms->cParams).hashLog;
  cVar2 = (char)uVar3;
  if (tfp == ZSTD_tfp_forCDict) {
    if (dtlm != ZSTD_dtlm_full) {
      __assert_fail("dtlm == ZSTD_dtlm_full",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x1d,
                    "void ZSTD_fillHashTableForCDict(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
                   );
    }
    pBVar8 = (ms->window).base;
    uVar10 = (ulong)ms->nextToUpdate;
    plVar9 = (long *)(pBVar8 + uVar10);
    uVar4 = (long)plVar9 + 3;
    if (uVar4 < (long)end - 6U) {
      if (0x20 < uVar3 + 8) {
LAB_001cb4e5:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      iVar6 = (ms->cParams).minMatch - 5;
      do {
        switch(iVar6) {
        case 0:
          lVar13 = -0x30e4432345000000;
          break;
        case 1:
          lVar13 = -0x30e4432340650000;
          break;
        case 2:
          lVar13 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar12 = *plVar9 * -0x30e44323485a9b9d;
          goto LAB_001cb2c3;
        default:
          uVar12 = (ulong)((uint)((int)*plVar9 * -0x61c8864f) >> (0x18U - cVar2 & 0x1f));
          goto LAB_001cb2c8;
        }
        uVar12 = lVar13 * *plVar9;
LAB_001cb2c3:
        uVar12 = uVar12 >> (0x38U - cVar2 & 0x3f);
LAB_001cb2c8:
        local_38 = (int)pBVar8;
        uVar3 = (int)plVar9 - local_38;
        if (0xffffff < uVar3) {
LAB_001cb488:
          __assert_fail("index >> (32 - ZSTD_SHORT_CACHE_TAG_BITS) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x561,"void ZSTD_writeTaggedIndex(U32 *const, size_t, U32)");
        }
        iVar5 = (uint)uVar10 * 0x100;
        uVar7 = (uint)uVar10 & 0xffffff;
        pUVar1[uVar12 >> 8] = uVar3 * 0x100 | (uint)uVar12 & 0xff;
        lVar13 = 1;
        do {
          iVar5 = iVar5 + 0x100;
          switch(iVar6) {
          case 0:
            lVar11 = -0x30e4432345000000;
            break;
          case 1:
            lVar11 = -0x30e4432340650000;
            break;
          case 2:
            lVar11 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar10 = *(long *)((long)plVar9 + lVar13) * -0x30e44323485a9b9d;
            goto LAB_001cb33b;
          default:
            uVar10 = (ulong)((uint)(*(int *)((long)plVar9 + lVar13) * -0x61c8864f) >>
                            (0x18U - cVar2 & 0x1f));
            goto LAB_001cb340;
          }
          uVar10 = lVar11 * *(long *)((long)plVar9 + lVar13);
LAB_001cb33b:
          uVar10 = uVar10 >> (0x38U - cVar2 & 0x3f);
LAB_001cb340:
          if (pUVar1[uVar10 >> 8] == 0) {
            if (0xffffff < (ulong)uVar7 + lVar13) goto LAB_001cb488;
            pUVar1[uVar10 >> 8] = ((uint)uVar10 & 0xff) + iVar5;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        uVar4 = uVar4 + 3;
        uVar10 = (ulong)(uVar7 + 3);
        plVar9 = (long *)((long)plVar9 + 3);
      } while (uVar4 < (long)end - 6U);
    }
  }
  else {
    if (dtlm != ZSTD_dtlm_fast) {
      __assert_fail("dtlm == ZSTD_dtlm_fast",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x40,
                    "void ZSTD_fillHashTableForCCtx(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
                   );
    }
    uVar4 = (ulong)ms->nextToUpdate;
    pBVar8 = (ms->window).base + uVar4 + 3;
    if (pBVar8 < (BYTE *)((long)end - 6U)) {
      if (0x1f < uVar3 && uVar3 - 0x20 != 0) goto LAB_001cb4e5;
      uVar7 = (ms->cParams).minMatch;
      do {
        switch(uVar7) {
        case 5:
          uVar10 = *(long *)(pBVar8 + -3) * -0x30e4432345000000;
          break;
        case 6:
          uVar10 = *(long *)(pBVar8 + -3) * -0x30e4432340650000;
          break;
        case 7:
          uVar10 = *(long *)(pBVar8 + -3) * -0x30e44323405a9d00;
          break;
        case 8:
          uVar10 = *(long *)(pBVar8 + -3) * -0x30e44323485a9b9d;
          break;
        default:
          uVar10 = (ulong)((uint)(*(int *)(pBVar8 + -3) * -0x61c8864f) >>
                          (-(char)(uVar3 - 0x20) & 0x1fU));
          goto LAB_001cb457;
        }
        uVar10 = uVar10 >> (0x40U - cVar2 & 0x3f);
LAB_001cb457:
        pUVar1[uVar10] = (U32)uVar4;
        pBVar8 = pBVar8 + 3;
        uVar4 = (ulong)((U32)uVar4 + 3);
      } while (pBVar8 < (BYTE *)((long)end - 6U));
    }
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillHashTableForCCtx(ms, end, dtlm);
    }
}